

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticFundamentalParameterData.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::operator==
          (UnderwaterAcousticFundamentalParameterData *this,
          UnderwaterAcousticFundamentalParameterData *Value)

{
  if (((((this->m_ui16AEPI == Value->m_ui16AEPI) &&
        (this->m_ui16ScanPattern == Value->m_ui16ScanPattern)) &&
       ((float)this->m_f32BeamCenterAzimuth == (float)Value->m_f32BeamCenterAzimuth)) &&
      ((!NAN((float)this->m_f32BeamCenterAzimuth) && !NAN((float)Value->m_f32BeamCenterAzimuth) &&
       ((float)this->m_f32AzimuthalBeamWidth == (float)Value->m_f32AzimuthalBeamWidth)))) &&
     (!NAN((float)this->m_f32AzimuthalBeamWidth) && !NAN((float)Value->m_f32AzimuthalBeamWidth))) {
    if (((float)this->m_f32BeamCenterDE == (float)Value->m_f32BeamCenterDE) &&
       (!NAN((float)this->m_f32BeamCenterDE) && !NAN((float)Value->m_f32BeamCenterDE))) {
      return (KBOOL)(-((float)Value->m_f32DEBeamwidth == (float)this->m_f32DEBeamwidth) & 1);
    }
  }
  return false;
}

Assistant:

KBOOL UnderwaterAcousticFundamentalParameterData::operator == ( const UnderwaterAcousticFundamentalParameterData & Value ) const
{
    if( m_ui16AEPI                != Value.m_ui16AEPI )              return false;
    if( m_ui16ScanPattern         != Value.m_ui16ScanPattern )       return false;
    if( m_f32BeamCenterAzimuth    != Value.m_f32BeamCenterAzimuth )  return false;
    if( m_f32AzimuthalBeamWidth   != Value.m_f32AzimuthalBeamWidth ) return false;
    if( m_f32BeamCenterDE         != Value.m_f32BeamCenterDE )       return false;
    if( m_f32DEBeamwidth          != Value.m_f32DEBeamwidth )        return false;
    return true;
}